

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationMiscDrawTests.cpp
# Opt level: O0

void vkt::tessellation::anon_unknown_2::initProgramsIsolinesCase
               (SourceCollections *programCollection,CaseDefinition *caseDef)

{
  CaseDefinition *this;
  char *pcVar1;
  ostream *poVar2;
  ProgramSources *this_00;
  string local_238;
  ShaderSource local_218;
  allocator<char> local_1e9;
  string local_1e8;
  ostringstream local_1c8 [8];
  ostringstream src;
  CaseDefinition local_40;
  CaseDefinition *local_18;
  CaseDefinition *caseDef_local;
  SourceCollections *programCollection_local;
  
  local_18 = caseDef;
  caseDef_local = (CaseDefinition *)programCollection;
  CaseDefinition::CaseDefinition(&local_40,caseDef);
  initCommonPrograms(programCollection,&local_40);
  CaseDefinition::~CaseDefinition(&local_40);
  std::__cxx11::ostringstream::ostringstream(local_1c8);
  pcVar1 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar2 = std::operator<<((ostream *)local_1c8,pcVar1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"#extension GL_EXT_tessellation_shader : require\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"layout(");
  pcVar1 = getTessPrimitiveTypeShaderName(caseDef->primitiveType);
  poVar2 = std::operator<<(poVar2,pcVar1);
  poVar2 = std::operator<<(poVar2,", ");
  pcVar1 = getSpacingModeShaderName(caseDef->spacingMode);
  poVar2 = std::operator<<(poVar2,pcVar1);
  poVar2 = std::operator<<(poVar2,") in;\n");
  poVar2 = std::operator<<(poVar2,"\n");
  pcVar1 = getTessLevelsSSBODeclaration();
  poVar2 = std::operator<<(poVar2,pcVar1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) in  highp vec2 in_te_position[];\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) out highp vec4 in_f_color;\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"void main (void)\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"    highp vec2 corner0 = in_te_position[0];\n");
  poVar2 = std::operator<<(poVar2,"    highp vec2 corner1 = in_te_position[1];\n");
  poVar2 = std::operator<<(poVar2,"    highp vec2 corner2 = in_te_position[2];\n");
  poVar2 = std::operator<<(poVar2,"    highp vec2 corner3 = in_te_position[3];\n");
  poVar2 = std::operator<<(poVar2,
                           "    highp vec2 pos = (1.0-gl_TessCoord.x)*(1.0-gl_TessCoord.y)*corner0\n"
                          );
  poVar2 = std::operator<<(poVar2,
                           "                   + (    gl_TessCoord.x)*(1.0-gl_TessCoord.y)*corner1\n"
                          );
  poVar2 = std::operator<<(poVar2,
                           "                   + (1.0-gl_TessCoord.x)*(    gl_TessCoord.y)*corner2\n"
                          );
  poVar2 = std::operator<<(poVar2,
                           "                   + (    gl_TessCoord.x)*(    gl_TessCoord.y)*corner3;\n"
                          );
  poVar2 = std::operator<<(poVar2,"    pos.y += 0.15*sin(gl_TessCoord.x*10.0);\n");
  poVar2 = std::operator<<(poVar2,"    gl_Position = vec4(pos, 0.0, 1.0);\n");
  poVar2 = std::operator<<(poVar2,
                           "    highp int phaseX = int(round(gl_TessCoord.x*sb_levels.outer1));\n");
  poVar2 = std::operator<<(poVar2,
                           "    highp int phaseY = int(round(gl_TessCoord.y*sb_levels.outer0));\n");
  poVar2 = std::operator<<(poVar2,"    highp int phase = (phaseX + phaseY) % 3;\n");
  poVar2 = std::operator<<(poVar2,"    in_f_color = phase == 0 ? vec4(1.0, 0.0, 0.0, 1.0)\n");
  poVar2 = std::operator<<(poVar2,"               : phase == 1 ? vec4(0.0, 1.0, 0.0, 1.0)\n");
  poVar2 = std::operator<<(poVar2,"               :              vec4(0.0, 0.0, 1.0, 1.0);\n");
  std::operator<<(poVar2,"}\n");
  this = caseDef_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"tese",&local_1e9);
  this_00 = ::vk::ProgramCollection<glu::ProgramSources>::add
                      ((ProgramCollection<glu::ProgramSources> *)this,&local_1e8);
  std::__cxx11::ostringstream::str();
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            ((TessellationEvaluationSource *)&local_218,&local_238);
  glu::ProgramSources::operator<<(this_00,&local_218);
  glu::TessellationEvaluationSource::~TessellationEvaluationSource
            ((TessellationEvaluationSource *)&local_218);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  std::__cxx11::ostringstream::~ostringstream(local_1c8);
  return;
}

Assistant:

void initProgramsIsolinesCase (vk::SourceCollections& programCollection, const CaseDefinition caseDef)
{
	DE_ASSERT(caseDef.primitiveType == TESSPRIMITIVETYPE_ISOLINES);

	initCommonPrograms(programCollection, caseDef);

	// Tessellation evaluation shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "#extension GL_EXT_tessellation_shader : require\n"
			<< "\n"
			<< "layout(" << getTessPrimitiveTypeShaderName(caseDef.primitiveType) << ", "
						 << getSpacingModeShaderName(caseDef.spacingMode) << ") in;\n"
			<< "\n"
			<< getTessLevelsSSBODeclaration()
			<< "\n"
			<< "layout(location = 0) in  highp vec2 in_te_position[];\n"
			<< "layout(location = 0) out highp vec4 in_f_color;\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    highp vec2 corner0 = in_te_position[0];\n"
			<< "    highp vec2 corner1 = in_te_position[1];\n"
			<< "    highp vec2 corner2 = in_te_position[2];\n"
			<< "    highp vec2 corner3 = in_te_position[3];\n"
			<< "    highp vec2 pos = (1.0-gl_TessCoord.x)*(1.0-gl_TessCoord.y)*corner0\n"
			<< "                   + (    gl_TessCoord.x)*(1.0-gl_TessCoord.y)*corner1\n"
			<< "                   + (1.0-gl_TessCoord.x)*(    gl_TessCoord.y)*corner2\n"
			<< "                   + (    gl_TessCoord.x)*(    gl_TessCoord.y)*corner3;\n"
			<< "    pos.y += 0.15*sin(gl_TessCoord.x*10.0);\n"
			<< "    gl_Position = vec4(pos, 0.0, 1.0);\n"
			<< "    highp int phaseX = int(round(gl_TessCoord.x*sb_levels.outer1));\n"
			<< "    highp int phaseY = int(round(gl_TessCoord.y*sb_levels.outer0));\n"
			<< "    highp int phase = (phaseX + phaseY) % 3;\n"
			<< "    in_f_color = phase == 0 ? vec4(1.0, 0.0, 0.0, 1.0)\n"
			<< "               : phase == 1 ? vec4(0.0, 1.0, 0.0, 1.0)\n"
			<< "               :              vec4(0.0, 0.0, 1.0, 1.0);\n"
			<< "}\n";

		programCollection.glslSources.add("tese") << glu::TessellationEvaluationSource(src.str());
	}
}